

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_pcm_rb_acquire_write(ma_pcm_rb *pRB,ma_uint32 *pSizeInFrames,void **ppBufferOut)

{
  uint uVar1;
  ma_uint32 mVar2;
  uint uVar3;
  ma_result mVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  
  mVar4 = -2;
  if ((pRB != (ma_pcm_rb *)0x0) && (ppBufferOut != (void **)0x0)) {
    mVar2 = pRB->channels;
    iVar6 = (&DAT_001158a0)[pRB->format];
    uVar3 = *pSizeInFrames * mVar2 * iVar6;
    uVar5 = (pRB->rb).encodedReadOffset;
    uVar1 = (pRB->rb).encodedWriteOffset;
    if ((int)(uVar1 ^ uVar5) < 0) {
      uVar5 = uVar5 & 0x7fffffff;
    }
    else {
      uVar5 = (pRB->rb).subbufferSizeInBytes;
    }
    uVar5 = uVar5 - (uVar1 & 0x7fffffff);
    if (uVar3 < uVar5) {
      uVar5 = uVar3;
    }
    __s = (void *)((ulong)((pRB->rb).encodedWriteOffset & 0x7fffffff) + (long)(pRB->rb).pBuffer);
    *ppBufferOut = __s;
    if (((pRB->rb).field_0x1c & 2) != 0) {
      memset(__s,0,(ulong)uVar5);
      mVar2 = pRB->channels;
      iVar6 = (&DAT_001158a0)[pRB->format];
    }
    mVar4 = 0;
    *pSizeInFrames = uVar5 / (iVar6 * mVar2);
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_pcm_rb_acquire_write(ma_pcm_rb* pRB, ma_uint32* pSizeInFrames, void** ppBufferOut)
{
    size_t sizeInBytes;
    ma_result result;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    sizeInBytes = *pSizeInFrames * ma_pcm_rb_get_bpf(pRB);

    result = ma_rb_acquire_write(&pRB->rb, &sizeInBytes, ppBufferOut);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pSizeInFrames = (ma_uint32)(sizeInBytes / ma_pcm_rb_get_bpf(pRB));
    return MA_SUCCESS;
}